

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reduce.cpp
# Opt level: O3

void __thiscall tst_helpers_reduce::emptySequence(tst_helpers_reduce *this)

{
  QSharedData *pQVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  bool called;
  uint local_24;
  Type p;
  
  called = false;
  local_24 = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&p,(int *)&local_24);
  iVar3 = waitForValue<int>((QPromise<int> *)&p,(int *)0xffffffff);
  cVar2 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                          ,0x58);
  if (cVar2 != '\0') {
    local_24 = local_24 & 0xffffff00;
    pcVar4 = QTest::toString<bool>(&called);
    pcVar5 = QTest::toString<bool>((bool *)&local_24);
    QTest::compare_helper
              (true,"Compared values are not the same",pcVar4,pcVar5,"called","false",
               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
               ,0x59);
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013f8c0;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_helpers_reduce::emptySequence()
{
    bool called = false;

    auto p = QtPromise::reduce(
        QVector<int>{},
        [&](...) {
            called = true;
            return 43;
        },
        42);

    // NOTE(SB): reduce() on an empty sequence without an initial value is an error!

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(called, false);
}